

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O2

pointer_type
cppcms::impl::
mfunc_to_io_handler<cppcms::impl::cgi::scgi,std::shared_ptr<cppcms::impl::cgi::scgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
          (offset_in_scgi_to_subr f,shared_ptr<cppcms::impl::cgi::scgi> *s,
          callback<void_(const_std::error_code_&)> *p1)

{
  io_handler_binder_p1<void_(cppcms::impl::cgi::scgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::scgi>,_booster::callback<void_(const_std::error_code_&)>_>
  *this;
  shared_ptr<cppcms::impl::cgi::scgi> *in_RCX;
  callback<void_(const_std::error_code_&)> *in_R8;
  shared_ptr<cppcms::impl::cgi::scgi> *local_38;
  callback<void_(const_std::error_code_&)> *local_30;
  
  local_38 = s;
  local_30 = p1;
  this = (io_handler_binder_p1<void_(cppcms::impl::cgi::scgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::scgi>,_booster::callback<void_(const_std::error_code_&)>_>
          *)operator_new(0x38);
  io_handler_binder_p1<void_(cppcms::impl::cgi::scgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::scgi>,_booster::callback<void_(const_std::error_code_&)>_>
  ::io_handler_binder_p1(this,(offset_in_scgi_to_subr *)&local_38,in_RCX,in_R8);
  *(io_handler_binder_p1<void_(cppcms::impl::cgi::scgi::*)(const_std::error_code_&,_unsigned_long,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::scgi>,_booster::callback<void_(const_std::error_code_&)>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_(const_std::error_code_&,_unsigned_long)> *)f;
}

Assistant:

booster::aio::io_handler::pointer_type mfunc_to_io_handler(void (C::*f)(booster::system::error_code const &,size_t,P1),S s,P1in const &p1)
{
	return new io_handler_binder_p1<void (C::*)(booster::system::error_code const &,size_t,P1),S,P1in>(f,s,p1);
}